

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_policy.cpp
# Opt level: O0

void __thiscall
despot::ModeStatePolicy::ModeStatePolicy
          (ModeStatePolicy *this,DSPOMDP *model,StateIndexer *indexer,StatePolicy *policy,
          ParticleLowerBound *bound)

{
  int iVar1;
  ParticleLowerBound *bound_local;
  StatePolicy *policy_local;
  StateIndexer *indexer_local;
  DSPOMDP *model_local;
  ModeStatePolicy *this_local;
  
  DefaultPolicy::DefaultPolicy(&this->super_DefaultPolicy,model,bound);
  (this->super_DefaultPolicy).super_ScenarioLowerBound._vptr_ScenarioLowerBound =
       (_func_int **)&PTR__ModeStatePolicy_0026e328;
  this->indexer_ = indexer;
  this->policy_ = policy;
  std::vector<double,_std::allocator<double>_>::vector(&this->state_probs_);
  iVar1 = (*this->indexer_->_vptr_StateIndexer[2])();
  std::vector<double,_std::allocator<double>_>::resize(&this->state_probs_,(long)iVar1);
  return;
}

Assistant:

ModeStatePolicy::ModeStatePolicy(const DSPOMDP* model,
	const StateIndexer& indexer, const StatePolicy& policy,
	ParticleLowerBound* bound) :
	DefaultPolicy(model, bound),
	indexer_(indexer),
	policy_(policy) {
	state_probs_.resize(indexer_.NumStates());
}